

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

void mtbdd_gc_mark_external_refs_WRAP(WorkerP *w,Task *__dq_head,TD_mtbdd_gc_mark_external_refs *t)

{
  TD_mtbdd_gc_mark_external_refs *t_local;
  Task *__dq_head_local;
  WorkerP *w_local;
  
  mtbdd_gc_mark_external_refs_CALL(w,__dq_head);
  return;
}

Assistant:

VOID_TASK_0(mtbdd_gc_mark_external_refs)
{
    // iterate through refs hash table, mark all found
    size_t count=0;
    uint64_t *it = refs_iter(&mtbdd_refs, 0, mtbdd_refs.refs_size);
    while (it != NULL) {
        SPAWN(mtbdd_gc_mark_rec, refs_next(&mtbdd_refs, &it, mtbdd_refs.refs_size));
        count++;
    }
    while (count--) {
        SYNC(mtbdd_gc_mark_rec);
    }
}